

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

int __thiscall QComboBoxPrivateContainer::topMargin(QComboBoxPrivateContainer *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  QListView *this_00;
  QTableView *this_01;
  
  this_00 = (QListView *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
  if (this_00 != (QListView *)0x0) {
    iVar2 = QListView::spacing(this_00);
    return iVar2;
  }
  this_01 = (QTableView *)QMetaObject::cast((QObject *)&QTableView::staticMetaObject);
  if (this_01 == (QTableView *)0x0) {
    uVar3 = 0;
  }
  else {
    bVar1 = QTableView::showGrid(this_01);
    uVar3 = (uint)bVar1;
  }
  return uVar3;
}

Assistant:

int QComboBoxPrivateContainer::topMargin() const
{
    if (const QListView *lview = qobject_cast<const QListView*>(view))
        return lview->spacing();
#if QT_CONFIG(tableview)
    if (const QTableView *tview = qobject_cast<const QTableView*>(view))
        return tview->showGrid() ? 1 : 0;
#endif
    return 0;
}